

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O2

Abc_Obj_t * Abc_NtkFetchTwinNode(Abc_Obj_t *pNode)

{
  Mio_Gate_t *pMVar1;
  Abc_Obj_t *pAVar2;
  Mio_Gate_t *pMVar3;
  
  if (pNode->pNtk->ntkFunc != ABC_FUNC_MAP) {
    __assert_fail("Abc_NtkHasMapping(pNode->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcMap.c"
                  ,0x31b,"Abc_Obj_t *Abc_NtkFetchTwinNode(Abc_Obj_t *)");
  }
  pMVar3 = (Mio_Gate_t *)(pNode->field_5).pData;
  if ((pMVar3 != (Mio_Gate_t *)0x0) &&
     (pMVar1 = Mio_GateReadTwin(pMVar3), pMVar1 != (Mio_Gate_t *)0x0)) {
    if ((pNode->Id != pNode->pNtk->vObjs->nSize + -1) &&
       (((pAVar2 = Abc_NtkObj(pNode->pNtk,pNode->Id + 1), pAVar2 != (Abc_Obj_t *)0x0 &&
         ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) &&
        ((pNode->vFanins).nSize == (pAVar2->vFanins).nSize)))) {
      pMVar3 = Mio_GateReadTwin(pMVar3);
      if (pMVar3 != (Mio_Gate_t *)(pAVar2->field_5).pData) {
        return (Abc_Obj_t *)0x0;
      }
      return pAVar2;
    }
  }
  return (Abc_Obj_t *)0x0;
}

Assistant:

Abc_Obj_t * Abc_NtkFetchTwinNode( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pNode2;
    Mio_Gate_t * pGate = (Mio_Gate_t *)pNode->pData;
    assert( Abc_NtkHasMapping(pNode->pNtk) );
    if ( pGate == NULL || Mio_GateReadTwin(pGate) == NULL )
        return NULL;
    // assuming the twin node is following next
    if ( (int)Abc_ObjId(pNode) == Abc_NtkObjNumMax(pNode->pNtk) - 1 )
        return NULL;
    pNode2 = Abc_NtkObj( pNode->pNtk, Abc_ObjId(pNode) + 1 );
    if ( pNode2 == NULL || !Abc_ObjIsNode(pNode2) || Abc_ObjFaninNum(pNode) != Abc_ObjFaninNum(pNode2) )
        return NULL;
    if ( Mio_GateReadTwin(pGate) != (Mio_Gate_t *)pNode2->pData )
        return NULL;
    return pNode2;
}